

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::TaggedPatternSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,TaggedPatternSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  size_t index_local;
  TaggedPatternSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->tagged).kind;
    token._2_1_ = (this->tagged).field_0x2;
    token.numFlags.raw = (this->tagged).numFlags.raw;
    token.rawLen = (this->tagged).rawLen;
    token.info = (this->tagged).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    token_00.kind = (this->memberName).kind;
    token_00._2_1_ = (this->memberName).field_0x2;
    token_00.numFlags.raw = (this->memberName).numFlags.raw;
    token_00.rawLen = (this->memberName).rawLen;
    token_00.info = (this->memberName).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else if (index == 2) {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&this->pattern->super_SyntaxNode);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax TaggedPatternSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return tagged;
        case 1: return memberName;
        case 2: return pattern;
        default: return nullptr;
    }
}